

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec_filter_test.cxx
# Opt level: O0

void encrypt_using_filter<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      last,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  reference s;
  difference_type n;
  char *input;
  rotation_key_provider local_180;
  rotating_evp_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
  local_178;
  undefined1 local_168 [8];
  filtering_ostream output;
  size_t input_size;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_local;
  
  output.
  super_filtering_stream_base<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>,_boost::iostreams::public_>
  ._296_8_ = last._M_current;
  input_size = (size_t)d_first.container;
  d_first_local.container = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)last._M_current
  ;
  last_local = first;
  std::
  distance<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (first,last);
  boost::iostreams::
  filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
  ::filtering_stream((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                      *)local_168);
  rotation_key_provider::rotation_key_provider(&local_180);
  cryptox::
  create_rotating_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>>,rotation_key_provider>
            ((cryptox *)&local_178,&local_180,0x200);
  boost::iostreams::detail::
  chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
  ::
  push<cryptox::rotating_evp_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>>,rotation_key_provider>>
            ((chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
              *)local_168,&local_178,-1,-1,(type *)0x0);
  cryptox::
  rotating_evp_filter<cryptox::encryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
  ::~rotating_evp_filter(&local_178);
  boost::iostreams::detail::
  chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
  ::push<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((chain_client<boost::iostreams::chain<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>>>
              *)local_168,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &input_size,-1,-1,(type *)0x0);
  s = __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&last_local);
  n = std::
      distance<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (last_local,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )d_first_local.container);
  boost::iostreams::
  write<boost::iostreams::filtering_stream<boost::iostreams::output,char,std::char_traits<char>,std::allocator<char>,boost::iostreams::public_>>
            ((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
              *)local_168,(type *)s,n);
  boost::iostreams::detail::
  chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::reset((chain_client<boost::iostreams::chain<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_168);
  boost::iostreams::
  filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
  ::~filtering_stream((filtering_stream<boost::iostreams::output,_char,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::public_>
                       *)local_168);
  return;
}

Assistant:

static void encrypt_using_filter(Input first, Input last, Output d_first) {
	boost::iostreams::filtering_ostream output;
	output.push(cryptox::create_filter(
		new cryptox::encryptor<cipher_type> (
			key.begin(), key.end(),
			iv.begin(),  iv.end()
		)
	));

	output.push(d_first);

	// Ugly, but effective for this test module.
	const char* input = (const char*)&(*first);

	boost::iostreams::write(output, input, std::distance(first, last));
	output.reset();
}